

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O0

int32_t ucptrie_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                       UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  ushort uVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  UCPTrieHeader *outTrie;
  int32_t minIndexLength;
  UCPTrieType type;
  UCPTrieValueWidth valueWidth;
  int32_t size;
  int32_t dataLength;
  UCPTrieHeader trie;
  UCPTrieHeader *inTrie;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((ds == (UDataSwapper *)0x0) || (inData == (void *)0x0)) ||
       ((-1 < length && (outData == (void *)0x0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      ds_local._4_4_ = UCPTRIE_TYPE_FAST;
    }
    else if ((length < 0) || (0xf < length)) {
      uVar7 = (*ds->readUInt32)(*inData);
      uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
      uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 6));
      uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 8));
      uVar8 = (int)(uint)uVar2 >> 6 & 3;
      uVar5 = uVar2 & 7;
      uVar9 = (uVar2 & 0xf000) << 4 | (uint)uVar4;
      uVar6 = 0x40;
      if (uVar8 == 0) {
        uVar6 = 0x400;
      }
      if ((((uVar7 == 0x54726933) && (uVar8 < 2)) && ((uVar2 & 0x38) == 0)) &&
         (((uVar5 < 3 && (uVar6 <= uVar3)) && (0x7f < uVar9)))) {
        iVar10 = uVar3 + 0x10 + (uint)uVar3;
        if ((uVar2 & 7) == 0) {
          type = uVar9 * 2 + iVar10;
        }
        else if (uVar5 == 1) {
          type = uVar9 * 4 + iVar10;
        }
        else {
          if (uVar5 != 2) {
            *pErrorCode = U_INVALID_FORMAT_ERROR;
            return 0;
          }
          type = uVar9 + iVar10;
        }
        if (-1 < length) {
          if (length < type) {
            *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
          (*ds->swapArray32)(ds,inData,4,outData,pErrorCode);
          (*ds->swapArray16)(ds,(void *)((long)inData + 4),0xc,(void *)((long)outData + 4),
                             pErrorCode);
          if ((uVar2 & 7) == 0) {
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),(uVar3 + uVar9) * 2,
                               (void *)((long)outData + 0x10),pErrorCode);
          }
          else if (uVar5 == 1) {
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),(uint)uVar3 << 1,
                               (void *)((long)outData + 0x10),pErrorCode);
            (*ds->swapArray32)(ds,(void *)((long)inData + (long)(int)(uint)uVar3 * 2 + 0x10),
                               uVar9 << 2,
                               (void *)((long)outData + (long)(int)(uint)uVar3 * 2 + 0x10),
                               pErrorCode);
          }
          else {
            if (uVar5 != 2) {
              *pErrorCode = U_INVALID_FORMAT_ERROR;
              return 0;
            }
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),(uint)uVar3 << 1,
                               (void *)((long)outData + 0x10),pErrorCode);
            if (inData != outData) {
              memmove((void *)((long)outData + (long)(int)(uint)uVar3 * 0x10 + 0x10),
                      (void *)((long)inData + (long)(int)(uint)uVar3 * 0x10 + 0x10),(long)(int)uVar9
                     );
            }
          }
        }
        ds_local._4_4_ = type;
      }
      else {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        ds_local._4_4_ = UCPTRIE_TYPE_FAST;
      }
    }
    else {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = UCPTRIE_TYPE_FAST;
    }
  }
  else {
    ds_local._4_4_ = UCPTRIE_TYPE_FAST;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_swap(const UDataSwapper *ds,
             const void *inData, int32_t length, void *outData,
             UErrorCode *pErrorCode) {
    const UCPTrieHeader *inTrie;
    UCPTrieHeader trie;
    int32_t dataLength, size;
    UCPTrieValueWidth valueWidth;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==nullptr || inData==nullptr || (length>=0 && outData==nullptr)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    if(length>=0 && length<(int32_t)sizeof(UCPTrieHeader)) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inTrie=(const UCPTrieHeader *)inData;
    trie.signature=ds->readUInt32(inTrie->signature);
    trie.options=ds->readUInt16(inTrie->options);
    trie.indexLength=ds->readUInt16(inTrie->indexLength);
    trie.dataLength = ds->readUInt16(inTrie->dataLength);

    UCPTrieType type = (UCPTrieType)((trie.options >> 6) & 3);
    valueWidth = (UCPTrieValueWidth)(trie.options & UCPTRIE_OPTIONS_VALUE_BITS_MASK);
    dataLength = ((int32_t)(trie.options & UCPTRIE_OPTIONS_DATA_LENGTH_MASK) << 4) | trie.dataLength;

    int32_t minIndexLength = type == UCPTRIE_TYPE_FAST ?
        UCPTRIE_BMP_INDEX_LENGTH : UCPTRIE_SMALL_INDEX_LENGTH;
    if( trie.signature!=UCPTRIE_SIG ||
        type > UCPTRIE_TYPE_SMALL ||
        (trie.options & UCPTRIE_OPTIONS_RESERVED_MASK) != 0 ||
        valueWidth > UCPTRIE_VALUE_BITS_8 ||
        trie.indexLength < minIndexLength ||
        dataLength < ASCII_LIMIT
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR; /* not a UCPTrie */
        return 0;
    }

    size=sizeof(UCPTrieHeader)+trie.indexLength*2;
    switch(valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        size+=dataLength*2;
        break;
    case UCPTRIE_VALUE_BITS_32:
        size+=dataLength*4;
        break;
    case UCPTRIE_VALUE_BITS_8:
        size+=dataLength;
        break;
    default:
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(length>=0) {
        UCPTrieHeader *outTrie;

        if(length<size) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTrie=(UCPTrieHeader *)outData;

        /* swap the header */
        ds->swapArray32(ds, &inTrie->signature, 4, &outTrie->signature, pErrorCode);
        ds->swapArray16(ds, &inTrie->options, 12, &outTrie->options, pErrorCode);

        /* swap the index and the data */
        switch(valueWidth) {
        case UCPTRIE_VALUE_BITS_16:
            ds->swapArray16(ds, inTrie+1, (trie.indexLength+dataLength)*2, outTrie+1, pErrorCode);
            break;
        case UCPTRIE_VALUE_BITS_32:
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            ds->swapArray32(ds, (const uint16_t *)(inTrie+1)+trie.indexLength, dataLength*4,
                                     (uint16_t *)(outTrie+1)+trie.indexLength, pErrorCode);
            break;
        case UCPTRIE_VALUE_BITS_8:
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            if(inTrie!=outTrie) {
                uprv_memmove((outTrie+1)+trie.indexLength, (inTrie+1)+trie.indexLength, dataLength);
            }
            break;
        default:
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return 0;
        }
    }

    return size;
}